

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
VulkanHppGenerator::gatherResultCodes_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,VulkanHppGenerator *this)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  bool bVar3;
  const_iterator cVar4;
  EnumValueData *pEVar5;
  EnumValueAlias *pEVar6;
  long lVar7;
  EnumValueData rc;
  EnumValueAlias ac;
  allocator<char> local_15c;
  allocator<char> local_15b;
  allocator<char> local_15a;
  allocator<char> local_159;
  VulkanHppGenerator *local_158;
  EnumValueData *local_150;
  undefined1 local_148 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  undefined1 local_a8 [16];
  EnumValueAlias local_98;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"VkResult",(allocator<char> *)(local_a8 + 0x10));
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
          ::find(&(this->m_enums)._M_t,(key_type *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  local_158 = this;
  if ((_Rb_tree_header *)cVar4._M_node != &(this->m_enums)._M_t._M_impl.super__Rb_tree_header) {
    p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_150 = (EnumValueData *)cVar4._M_node[5]._M_right;
    for (pEVar5 = (EnumValueData *)cVar4._M_node[5]._M_left; pEVar5 != local_150;
        pEVar5 = pEVar5 + 1) {
      EnumValueData::EnumValueData((EnumValueData *)local_148,pEVar5);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_108);
      uVar2 = local_148._8_8_;
      for (pEVar6 = (EnumValueAlias *)local_148._0_8_; pEVar6 != (EnumValueAlias *)uVar2;
          pEVar6 = pEVar6 + 1) {
        EnumValueAlias::EnumValueAlias((EnumValueAlias *)(local_a8 + 0x10),pEVar6);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)__return_storage_ptr__,&local_98.name);
        EnumValueAlias::~EnumValueAlias((EnumValueAlias *)(local_a8 + 0x10));
      }
      EnumValueData::~EnumValueData((EnumValueData *)local_148);
    }
    bVar3 = std::operator==(&local_158->m_api,"vulkansc");
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_148,"VK_ERROR_FRAGMENTATION_EXT",
                 (allocator<char> *)(local_a8 + 0x10));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_148 + 0x20),"VK_ERROR_INVALID_EXTERNAL_HANDLE_KHR",&local_159);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"VK_ERROR_INVALID_OPAQUE_CAPTURE_ADDRESS_KHR",&local_15a);
      std::__cxx11::string::string<std::allocator<char>>
                (local_e8,"VK_ERROR_NOT_PERMITTED_EXT",&local_15b);
      std::__cxx11::string::string<std::allocator<char>>
                (local_c8,"VK_PIPELINE_COMPILE_REQUIRED_EXT",&local_15c);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_range_unique<std::__cxx11::string_const*>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      lVar7 = 0x80;
      do {
        std::__cxx11::string::~string((string *)(local_148 + lVar7));
        lVar7 = lVar7 + -0x20;
      } while (lVar7 != -0x20);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("resultIt != m_enums.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x84f,"std::set<std::string> VulkanHppGenerator::gatherResultCodes() const");
}

Assistant:

std::set<std::string> VulkanHppGenerator::gatherResultCodes() const
{
  auto resultIt = m_enums.find( "VkResult" );
  assert( resultIt != m_enums.end() );
  std::set<std::string> resultCodes;
  for ( auto rc : resultIt->second.values )
  {
    resultCodes.insert( rc.name );
    for ( auto ac : rc.aliases )
    {
      resultCodes.insert( ac.name );
    }
  }
  // some special handling needed for vulkansc!!
  if ( m_api == "vulkansc" )
  {
    resultCodes.insert( { "VK_ERROR_FRAGMENTATION_EXT",
                          "VK_ERROR_INVALID_EXTERNAL_HANDLE_KHR",
                          "VK_ERROR_INVALID_OPAQUE_CAPTURE_ADDRESS_KHR",
                          "VK_ERROR_NOT_PERMITTED_EXT",
                          "VK_PIPELINE_COMPILE_REQUIRED_EXT" } );
  }
  return resultCodes;
}